

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

ARKInterp arkInterpCreate_Lagrange(void *arkode_mem,int degree)

{
  ARKInterpOps __ptr;
  int *__s;
  int in_ESI;
  long in_RDI;
  ARKodeMem ark_mem;
  ARKInterpOps ops;
  ARKInterpContent_Lagrange content;
  ARKInterp interp;
  int local_3c;
  ARKInterp local_8;
  
  if (in_RDI == 0) {
    local_8 = (ARKInterp)0x0;
  }
  else if ((in_ESI < 0) || (5 < in_ESI)) {
    local_8 = (ARKInterp)0x0;
  }
  else {
    local_8 = (ARKInterp)malloc(0x10);
    if (local_8 == (ARKInterp)0x0) {
      local_8 = (ARKInterp)0x0;
    }
    else {
      __ptr = (ARKInterpOps)malloc(0x38);
      if (__ptr == (ARKInterpOps)0x0) {
        free(local_8);
        local_8 = (ARKInterp)0x0;
      }
      else {
        __ptr->resize = arkInterpResize_Lagrange;
        __ptr->free = arkInterpFree_Lagrange;
        __ptr->print = arkInterpPrintMem_Lagrange;
        __ptr->setdegree = arkInterpSetDegree_Lagrange;
        __ptr->init = arkInterpInit_Lagrange;
        __ptr->update = arkInterpUpdate_Lagrange;
        __ptr->evaluate = arkInterpEvaluate_Lagrange;
        __s = (int *)malloc(0x28);
        if (__s == (int *)0x0) {
          free(__ptr);
          free(local_8);
          local_8 = (ARKInterp)0x0;
        }
        else {
          memset(__s,0,0x28);
          local_8->ops = __ptr;
          local_8->content = __s;
          if (in_ESI + 1 < 6) {
            local_3c = in_ESI + 1;
          }
          else {
            local_3c = 6;
          }
          *__s = local_3c;
          __s[1] = 0;
          __s[6] = 0;
          __s[4] = 0;
          __s[5] = 0;
          __s[2] = 0;
          __s[3] = 0;
          *(double *)(__s + 8) = *(double *)(in_RDI + 8) * 100.0;
          *(long *)(in_RDI + 0x218) = (long)(*__s + 1) + *(long *)(in_RDI + 0x218);
          *(long *)(in_RDI + 0x220) = (long)(*__s + 2) + *(long *)(in_RDI + 0x220);
        }
      }
    }
  }
  return local_8;
}

Assistant:

ARKInterp arkInterpCreate_Lagrange(void* arkode_mem, int degree)
{
  ARKInterp interp;
  ARKInterpContent_Lagrange content;
  ARKInterpOps ops;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* check for valid degree */
  if (degree < 0 || degree > ARK_INTERP_MAX_DEGREE) return(NULL);

  /* allocate overall structure */
  interp = NULL;
  interp = (ARKInterp) malloc(sizeof *interp);
  if (interp == NULL)  return(NULL);

  /* allocate ops structure and set entries */
  ops = NULL;
  ops = (ARKInterpOps) malloc(sizeof *ops);
  if (ops == NULL) { free(interp); return(NULL); }
  ops->resize    = arkInterpResize_Lagrange;
  ops->free      = arkInterpFree_Lagrange;
  ops->print     = arkInterpPrintMem_Lagrange;
  ops->setdegree = arkInterpSetDegree_Lagrange;
  ops->init      = arkInterpInit_Lagrange;
  ops->update    = arkInterpUpdate_Lagrange;
  ops->evaluate  = arkInterpEvaluate_Lagrange;

  /* create content, and initialize everything to zero/NULL */
  content = NULL;
  content = (ARKInterpContent_Lagrange) malloc(sizeof *content);
  if (content == NULL) { free(ops); free(interp); return(NULL); }
  memset(content, 0, sizeof(struct _ARKInterpContent_Lagrange));

  /* attach ops and content structures to overall structure */
  interp->ops = ops;
  interp->content = content;

  /* fill content */

  /* maximum/current history length */
  content->nmax      = SUNMIN(degree+1, ARK_INTERP_MAX_DEGREE+1);  /* respect maximum possible */
  content->nmaxalloc = 0;
  content->nhist     = 0;

  /* initialize time/solution history arrays to NULL */
  content->thist = NULL;
  content->yhist = NULL;

  /* initial t roundoff value */
  content->tround = FUZZ_FACTOR*ark_mem->uround;

  /* update workspace sizes */
  ark_mem->lrw += content->nmax + 1;
  ark_mem->liw += content->nmax + 2;

  return(interp);
}